

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_pairing.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true,_true>_>_>
::_add_bar(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_true,_true,_true>_>_>
           *this,Dimension dim,Pos_index birth)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  Pos_index local_34;
  _List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_> local_30;
  
  local_34 = birth;
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(Dimension *)&p_Var2[1]._M_next = dim;
  *(Pos_index *)((long)&p_Var2[1]._M_next + 4) = birth;
  *(undefined4 *)&p_Var2[1]._M_prev = 0xffffffff;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->barcode_).
            super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  local_30._M_node =
       (this->barcode_).
       super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ._M_impl._M_node.super__List_node_base._M_prev;
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>&>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>,std::allocator<std::pair<unsigned_int_const,std::_List_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->indexToBar_,(const_iterator)0x0,&local_34,&local_30);
  return;
}

Assistant:

void _add_bar(Dimension dim, Pos_index birth) {
    barcode_.emplace_back(birth, Master_matrix::template get_null_value<Pos_index>(), dim);
    if constexpr (Master_matrix::hasFixedBarcode || !Master_matrix::Option_list::has_removable_columns) {
      indexToBar_.push_back(barcode_.size() - 1);
    } else {
      indexToBar_.try_emplace(birth, --barcode_.end());
    }
  }